

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SmallVector<spirv_cross::SpecializationConstant,_8UL> * __thiscall
spirv_cross::Compiler::get_specialization_constants
          (SmallVector<spirv_cross::SpecializationConstant,_8UL> *__return_storage_ptr__,
          Compiler *this)

{
  size_t *psVar1;
  uint uVar2;
  ID id;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  Variant *pVVar5;
  bool bVar6;
  uint32_t uVar7;
  SPIRConstant *pSVar8;
  long lVar9;
  ParsedIR *this_00;
  SpecializationConstant SVar10;
  LoopLock local_48;
  AlignedBuffer<spirv_cross::SpecializationConstant,_8UL> *local_40;
  Compiler *local_38;
  
  local_40 = &__return_storage_ptr__->stack_storage;
  (__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>).ptr =
       (SpecializationConstant *)0x0;
  (__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>).buffer_size = 0;
  (__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>).ptr =
       (SpecializationConstant *)local_40;
  __return_storage_ptr__->buffer_capacity = 8;
  this_00 = &this->ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->ir).ids_for_type[3].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar3 != 0) {
    pTVar4 = (this->ir).ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar9 = 0;
    local_38 = this;
    do {
      uVar2 = *(uint *)((long)&pTVar4->id + lVar9);
      pVVar5 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar2].type == TypeConstant) {
        pSVar8 = Variant::get<spirv_cross::SPIRConstant>(pVVar5 + uVar2);
        if (pSVar8->specialization == true) {
          bVar6 = ParsedIR::has_decoration
                            (this_00,(ID)(pSVar8->super_IVariant).self.id,DecorationSpecId);
          if (bVar6) {
            id.id = (pSVar8->super_IVariant).self.id;
            uVar7 = ParsedIR::get_decoration(this_00,id,DecorationSpecId);
            SmallVector<spirv_cross::SpecializationConstant,_8UL>::reserve
                      (__return_storage_ptr__,
                       (__return_storage_ptr__->
                       super_VectorView<spirv_cross::SpecializationConstant>).buffer_size + 1);
            SVar10.constant_id = uVar7;
            SVar10.id.id = id.id;
            (__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>).ptr
            [(__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>).
             buffer_size] = SVar10;
            psVar1 = &(__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>
                      ).buffer_size;
            *psVar1 = *psVar1 + 1;
            this = local_38;
          }
        }
      }
      lVar9 = lVar9 + 4;
    } while (sVar3 << 2 != lVar9);
  }
  ParsedIR::LoopLock::~LoopLock(&local_48);
  return __return_storage_ptr__;
}

Assistant:

SmallVector<SpecializationConstant> Compiler::get_specialization_constants() const
{
	SmallVector<SpecializationConstant> spec_consts;
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, const SPIRConstant &c) {
		if (c.specialization && has_decoration(c.self, DecorationSpecId))
			spec_consts.push_back({ c.self, get_decoration(c.self, DecorationSpecId) });
	});
	return spec_consts;
}